

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O0

itexture_comp * crnlib::create_texture_comp(crn_file_type file_type)

{
  crn_comp *pcStack_10;
  crn_file_type file_type_local;
  
  if (file_type == cCRNFileTypeCRN) {
    pcStack_10 = crnlib_new<crnlib::crn_comp>();
  }
  else if (file_type == cCRNFileTypeDDS) {
    pcStack_10 = (crn_comp *)crnlib_new<crnlib::dds_comp>();
  }
  else {
    pcStack_10 = (crn_comp *)0x0;
  }
  return &pcStack_10->super_itexture_comp;
}

Assistant:

static itexture_comp* create_texture_comp(crn_file_type file_type)
    {
        if (file_type == cCRNFileTypeCRN)
        {
            return crnlib_new<crn_comp>();
        }
        else if (file_type == cCRNFileTypeDDS)
        {
            return crnlib_new<dds_comp>();
        }
        else
        {
            return nullptr;
        }
    }